

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

int GetCombinedHistogramEntropy
              (VP8LHistogram *a,VP8LHistogram *b,int64_t cost_threshold_in,uint64_t *cost,
              uint64_t *costs)

{
  uint64_t uVar1;
  ulong *in_RCX;
  ulong in_RDX;
  long in_R8;
  uint64_t cost_threshold;
  int i;
  int local_34;
  int local_4;
  
  if ((long)in_RDX < 1) {
    local_4 = 0;
  }
  else {
    *in_RCX = 0;
    for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
      uVar1 = GetCombinedEntropy((VP8LHistogram *)cost_threshold_in,(VP8LHistogram *)cost,
                                 costs._4_4_);
      *(uint64_t *)(in_R8 + (long)local_34 * 8) = uVar1;
      *in_RCX = *(long *)(in_R8 + (long)local_34 * 8) + *in_RCX;
      if (in_RDX <= *in_RCX) {
        return 0;
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

WEBP_NODISCARD static int GetCombinedHistogramEntropy(
    const VP8LHistogram* const a, const VP8LHistogram* const b,
    int64_t cost_threshold_in, uint64_t* cost, uint64_t costs[5]) {
  int i;
  const uint64_t cost_threshold = (uint64_t)cost_threshold_in;
  assert(a->palette_code_bits == b->palette_code_bits);
  if (cost_threshold_in <= 0) return 0;
  *cost = 0;

  // No need to add the extra cost for length and distance as it is a constant
  // that does not influence the histograms.
  for (i = 0; i < 5; ++i) {
    costs[i] = GetCombinedEntropy(a, b, (HistogramIndex)i);
    *cost += costs[i];
    if (*cost >= cost_threshold) return 0;
  }

  return 1;
}